

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O2

int __thiscall
JsUtil::
BaseDictionary<char16_t_const*,DynamicProfileStorage::StorageInfo,Memory::NoCheckHeapAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::DictionaryEntry,JsUtil::NoResizeLock>
::FindEntryWithKey<char16_t_const*>
          (BaseDictionary<char16_t_const*,DynamicProfileStorage::StorageInfo,Memory::NoCheckHeapAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::DictionaryEntry,JsUtil::NoResizeLock>
           *this,char16_t **key)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  hash_t hashCode;
  uint uVar4;
  CacheHashedEntry<char16_t_const*,DynamicProfileStorage::StorageInfo,JsUtil::(anonymous_namespace)::KeyValueEntry>
  *pCVar5;
  DictionaryStats *this_00;
  int iVar6;
  
  lVar1 = *(long *)this;
  if (lVar1 == 0) {
    uVar4 = 0;
  }
  else {
    hashCode = GetHashCodeWithKey<char16_t_const*>(key);
    uVar4 = BaseDictionary<const_char16_t_*,_DynamicProfileStorage::StorageInfo,_Memory::NoCheckHeapAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::DictionaryEntry,_JsUtil::NoResizeLock>
            ::GetBucket((BaseDictionary<const_char16_t_*,_DynamicProfileStorage::StorageInfo,_Memory::NoCheckHeapAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::DictionaryEntry,_JsUtil::NoResizeLock>
                         *)this,hashCode);
    lVar2 = *(long *)(this + 8);
    pCVar5 = (CacheHashedEntry<char16_t_const*,DynamicProfileStorage::StorageInfo,JsUtil::(anonymous_namespace)::KeyValueEntry>
              *)(lVar1 + (ulong)uVar4 * 4);
    uVar4 = 0;
    while( true ) {
      iVar6 = *(int *)pCVar5;
      if ((long)iVar6 < 0) break;
      pCVar5 = (CacheHashedEntry<char16_t_const*,DynamicProfileStorage::StorageInfo,JsUtil::(anonymous_namespace)::KeyValueEntry>
                *)((long)iVar6 * 0x28 + lVar2);
      bVar3 = CacheHashedEntry<char16_t_const*,DynamicProfileStorage::StorageInfo,JsUtil::(anonymous_namespace)::KeyValueEntry>
              ::KeyEquals<DefaultComparer<char16_t_const*>,char16_t_const*>(pCVar5,key,hashCode);
      if (bVar3) {
        this_00 = *(DictionaryStats **)(this + 0x30);
        goto LAB_00893752;
      }
      uVar4 = uVar4 + 1;
      pCVar5 = pCVar5 + 0x10;
    }
  }
  this_00 = *(DictionaryStats **)(this + 0x30);
  iVar6 = -1;
LAB_00893752:
  if (this_00 != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(this_00,uVar4);
  }
  return iVar6;
}

Assistant:

inline int FindEntryWithKey(const LookupType& key) const
        {
#if PROFILE_DICTIONARY
            uint depth = 0;
#endif
            int * localBuckets = buckets;
            if (localBuckets != nullptr)
            {
                hash_t hashCode = GetHashCodeWithKey<LookupType>(key);
                uint targetBucket = this->GetBucket(hashCode);
                EntryType * localEntries = entries;
                for (int i = localBuckets[targetBucket]; i >= 0; i = localEntries[i].next)
                {
                    if (localEntries[i].template KeyEquals<Comparer<TKey>>(key, hashCode))
                    {
#if PROFILE_DICTIONARY
                        if (stats)
                            stats->Lookup(depth);
#endif
                        return i;
                    }

#if PROFILE_DICTIONARY
                    depth += 1;
#endif
                }
            }

#if PROFILE_DICTIONARY
            if (stats)
                stats->Lookup(depth);
#endif
            return -1;
        }